

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

void __thiscall asmjit::v1_14::ConstPool::fill(ConstPool *this,void *dst)

{
  char cVar1;
  char cVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  char cVar10;
  uint uVar11;
  byte *pbVar12;
  uint uVar13;
  size_t *extraout_RDX;
  ulong *puVar14;
  ulong *puVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong uVar18;
  char cVar19;
  uint uVar20;
  ulong *__src;
  uint *puVar21;
  undefined8 *__dest;
  byte *pbVar22;
  ulong uVar23;
  ulong *puVar24;
  ulong uVar25;
  uint *puVar26;
  long lVar27;
  long lVar28;
  size_t __n;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  uint in_XCR0;
  ulong uStack_370;
  undefined8 uStack_348;
  ulong uStack_340;
  ulong uStack_338;
  ulong uStack_330;
  undefined4 uStack_328;
  int iStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  undefined8 uStack_318;
  uint auStack_310 [16];
  ulong uStack_2d0;
  ulong uStack_2c8;
  ulong uStack_2c0;
  undefined8 uStack_2b8;
  void *pvStack_2b0;
  long lStack_2a8;
  long lStack_2a0;
  ulong *puStack_298;
  size_t sStack_290;
  ulong *puStack_288;
  undefined8 *puStack_280;
  ulong *puStack_278;
  size_t *psStack_270;
  ulong uStack_268;
  ulong *puStack_260;
  void *pvStack_258;
  long lStack_250;
  long lStack_248;
  undefined1 *puStack_240;
  size_t sStack_238;
  ulong *puStack_230;
  long local_228 [63];
  
  lVar27 = 0;
  __src = (ulong *)0x0;
  puStack_230 = (ulong *)0x11b54b;
  __dest = (undefined8 *)dst;
  memset(dst,0,this->_size);
  puVar17 = (ulong *)&this->field_0x8;
  __n = 1;
  while (*(ulong **)((long)puVar17 + lVar27 * 0x18) == (ulong *)0x0) {
LAB_0011b5ac:
    __n = __n * 2;
    lVar27 = lVar27 + 1;
    if (lVar27 == 7) {
      return;
    }
  }
  lVar28 = 0;
  puVar15 = *(ulong **)((long)puVar17 + lVar27 * 0x18);
  while( true ) {
    while (uVar23 = *puVar15, (ulong *)(uVar23 & 0xfffffffffffffffe) == (ulong *)0x0) {
      while( true ) {
        if ((puVar15[2] & 1) == 0) {
          __dest = (undefined8 *)((ulong)*(uint *)((long)puVar15 + 0x14) + (long)dst);
          __src = puVar15 + 3;
          puStack_230 = (ulong *)0x11b59d;
          memcpy(__dest,__src,__n);
        }
        puVar15 = (ulong *)puVar15[1];
        if (puVar15 != (ulong *)0x0) break;
        bVar32 = lVar28 == 0;
        lVar28 = lVar28 + -1;
        if (bVar32) goto LAB_0011b5ac;
        puVar15 = (ulong *)local_228[lVar28];
      }
    }
    if (lVar28 == 0x3e) break;
    local_228[lVar28] = (long)puVar15;
    lVar28 = lVar28 + 1;
    puVar15 = (ulong *)(uVar23 & 0xfffffffffffffffe);
  }
  puStack_230 = (ulong *)0x11b5cf;
  fill();
  puStack_230 = puVar15;
  sStack_238 = __n;
  puStack_240 = (undefined1 *)puVar17;
  lStack_248 = lVar28;
  lStack_250 = lVar27;
  pvStack_258 = dst;
  psStack_270 = extraout_RDX;
  if (*__src < 2) {
    puVar17 = __src;
    if (__src[1] == 0) {
      if (*__src == 0) {
        puVar17 = (ulong *)*__dest;
        if (puVar17 == (ulong *)0x0) {
          *__dest = __src;
        }
        else {
          puStack_280 = __dest;
          puVar15 = &uStack_268;
          uStack_268 = 0;
          puStack_260 = puVar17;
          *__src = 1;
          puStack_278 = __src + 3;
          uVar23 = 0;
          puVar14 = (ulong *)0x0;
          uVar18 = 0;
          puVar29 = (ulong *)0x0;
          while( true ) {
            uVar25 = uVar23;
            if (puVar17 == (ulong *)0x0) {
              puVar29[uVar25] = (ulong)((uint)puVar29[uVar25] & 1) | (ulong)__src;
              puVar16 = __src;
            }
            else {
              pbVar12 = (byte *)(*puVar17 & 0xfffffffffffffffe);
              puVar16 = puVar17;
              if ((((pbVar12 != (byte *)0x0) && ((*pbVar12 & 1) != 0)) &&
                  ((byte *)puVar17[1] != (byte *)0x0)) && ((*(byte *)puVar17[1] & 1) != 0)) {
                *puVar17 = *puVar17 | 1;
                *pbVar12 = *pbVar12 & 0xfe;
                *(ulong *)puVar17[1] = *(ulong *)puVar17[1] & 0xfffffffffffffffe;
              }
            }
            if (((puVar29 != (ulong *)0x0) && ((*puVar16 & 1) != 0)) && ((*puVar29 & 1) != 0)) {
              puVar17 = (ulong *)puVar15[1];
              bVar33 = uVar18 == 0;
              bVar32 = !bVar33;
              pbVar12 = (byte *)(puVar14[bVar32] & 0xfffffffffffffffe);
              pbVar22 = (byte *)(*(ulong *)(pbVar12 + (ulong)bVar33 * 8) & 0xfffffffffffffffe);
              if (puVar16 == (ulong *)(puVar29[uVar18] & 0xfffffffffffffffe)) {
                puVar24 = (ulong *)(pbVar12 + (ulong)bVar33 * 8);
                uVar23 = (ulong)pbVar22 | (ulong)((uint)puVar14[bVar32] & 1);
              }
              else {
                uVar18 = (ulong)((uint)bVar32 * 8);
                lVar27 = (ulong)bVar33 * 8;
                *(ulong *)(pbVar12 + lVar27) =
                     (ulong)((uint)*(ulong *)(pbVar12 + (ulong)bVar33 * 8) & 1) |
                     *(ulong *)(pbVar22 + uVar18) & 0xfffffffffffffffe;
                *(ulong *)(pbVar22 + uVar18) =
                     (ulong)((uint)*(undefined8 *)(pbVar22 + uVar18) & 1) | (ulong)pbVar12;
                *pbVar12 = *pbVar12 | 1;
                *pbVar22 = *pbVar22 & 0xfe;
                uVar23 = (ulong)((uint)*(undefined8 *)((long)puVar14 + uVar18) & 1);
                *(ulong *)((long)puVar14 + uVar18) = uVar23 | (ulong)pbVar22;
                puVar24 = (ulong *)(pbVar22 + lVar27);
                uVar23 = *(ulong *)(pbVar22 + lVar27) & 0xfffffffffffffffe | uVar23;
                pbVar12 = pbVar22;
              }
              puVar14[bVar32] = uVar23;
              *puVar24 = (ulong)((uint)*puVar24 & 1) | (ulong)puVar14;
              *(byte *)puVar14 = (byte)*puVar14 | 1;
              *pbVar12 = *pbVar12 & 0xfe;
              puVar15[puVar14 == puVar17] =
                   (ulong)((uint)puVar15[puVar14 == puVar17] & 1) | (ulong)pbVar12;
            }
            if (puVar16 == __src) break;
            puStack_288 = (ulong *)0x11b794;
            uVar7 = memcmp(puVar16 + 3,puStack_278,*psStack_270);
            if (puVar14 != (ulong *)0x0) {
              puVar15 = puVar14;
            }
            puVar17 = (ulong *)(puVar16[uVar7 >> 0x1f] & 0xfffffffffffffffe);
            uVar23 = (ulong)(uVar7 >> 0x1f);
            puVar14 = puVar29;
            uVar18 = uVar25;
            puVar29 = puVar16;
          }
          *puStack_280 = puStack_260;
          *(byte *)puStack_260 = (byte)*puStack_260 & 0xfe;
        }
        return;
      }
      goto LAB_0011b7e2;
    }
  }
  else {
    puStack_288 = (ulong *)0x11b7dd;
    ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>();
  }
  puStack_288 = (ulong *)0x11b7e2;
  ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>();
LAB_0011b7e2:
  puStack_288 = (ulong *)0x11b7e7;
  ZoneTree<asmjit::v1_14::ConstPool::Node>::insert<asmjit::v1_14::ConstPool::Compare>();
  puStack_288 = puVar15;
  sStack_290 = __n;
  puStack_298 = puVar17;
  lStack_2a0 = lVar28;
  lStack_2a8 = lVar27;
  pvStack_2b0 = dst;
  if (CpuInfo::host()::cpuInfoGlobal == '\0') {
    CpuInfo::host();
  }
  if (CpuInfo::host::cpuInfoInitialized.super___atomic_base<unsigned_int>._M_i != 0) {
    return;
  }
  puVar9 = (uint *)((long)&uStack_318 + 4);
  uStack_2d0 = 0;
  uStack_2c0 = 0;
  uStack_2b8 = 0;
  uStack_340 = 0;
  uStack_338 = 0;
  uStack_328 = 0;
  uStack_31c = 0;
  uStack_318 = 0;
  auStack_310[0] = 0;
  auStack_310[1] = 0;
  auStack_310[2] = 0;
  auStack_310[3] = 0;
  auStack_310[4] = 0;
  auStack_310[5] = 0;
  auStack_310[6] = 0;
  auStack_310[7] = 0;
  auStack_310[8] = 0;
  auStack_310[9] = 0;
  auStack_310[10] = 0;
  auStack_310[0xb] = 0;
  auStack_310[0xc] = 0;
  auStack_310[0xd] = 0;
  auStack_310[0xe] = 0;
  uStack_348 = 0x10002;
  uStack_330 = 1;
  uStack_2c8 = 0x80;
  puVar26 = (uint *)cpuid_basic_info(0);
  uVar7 = *puVar26;
  uVar23 = 0;
  puVar21 = (uint *)0x14cbb0;
  do {
    if (((puVar21[-2] == puVar26[1]) && (puVar21[-1] == puVar26[2])) && (*puVar21 == puVar26[3]))
    goto LAB_0011b8a3;
    uVar23 = uVar23 + 1;
    puVar21 = puVar21 + 5;
  } while (uVar23 != 4);
  uVar23 = 4;
LAB_0011b8a3:
  iStack_324 = (int)*(undefined8 *)
                     (&x86::
                       simplifyCpuVendor(asmjit::v1_14::CpuInfo&,unsigned_int,unsigned_int,unsigned_int)
                       ::table + (uVar23 & 0xffffffff) * 0x14);
  uStack_320 = (undefined4)
               ((ulong)*(undefined8 *)
                        (&x86::
                          simplifyCpuVendor(asmjit::v1_14::CpuInfo&,unsigned_int,unsigned_int,unsigned_int)
                          ::table + (uVar23 & 0xffffffff) * 0x14) >> 0x20);
  if (uVar7 != 0) {
    puVar26 = (uint *)cpuid_Version_info(1);
    uVar20 = *puVar26;
    uVar8 = puVar26[1];
    uVar4 = puVar26[2];
    uVar5 = puVar26[3];
    uVar11 = uVar20 >> 4 & 0xf;
    uVar13 = uVar20 >> 8 & 0xf;
    if ((uVar13 == 6) || (uVar13 == 0xf)) {
      uVar11 = uVar11 | uVar20 >> 0xc & 0xf0;
    }
    uVar6 = (uVar20 >> 0x14 & 0xff) + 0xf;
    if (uVar13 != 0xf) {
      uVar6 = uVar13;
    }
    uStack_348 = CONCAT44(uVar6,0x10002);
    uStack_340 = CONCAT44(uVar8,uVar11) & 0xffffffffff;
    uStack_338 = CONCAT44(uVar20 >> 0xc,uVar20) & 0x30000000f;
    uStack_330 = CONCAT44(uVar8 >> 5,uVar8 >> 0x10) & 0x7f8000000ff;
    uVar8 = uVar5 >> 0xd & 0x2000;
    uVar20 = uVar8 + (uVar5 & 0x20) * 4;
    uStack_2c0 = (ulong)uVar20;
    uVar23 = (ulong)(uVar5 >> 2 & 0x2000000);
    uVar11 = uVar4 >> 0x19 & 1;
    uVar18 = (ulong)(uVar4 >> 0x1a & 1);
    uStack_2c8 = uVar18 << 0x39 |
                 uVar18 << 0x3a |
                 (ulong)(uVar11 << 0xf) |
                 (ulong)uVar11 << 0x39 | (ulong)(uVar4 >> 0x18 & 1 | uVar4 >> 9 & 0x4000) |
                 (ulong)((uVar4 & 0x20) << 0x11) | (ulong)(uVar4 >> 4 & 1) << 0x28 |
                 (ulong)(uVar5 >> 0x1e & 1) << 0x26 | uVar23 |
                 (ulong)((uVar5 & 0x800000) << 6) |
                 (ulong)(uVar5 >> 4 & 0x40000) |
                 (ulong)(uVar5 >> 0x14 & 1) << 0x3d | (ulong)(uVar5 >> 0x13 & 1) << 0x3c |
                 (ulong)(uVar5 >> 9) << 0x3f | (ulong)(uVar5 >> 6 & 1) << 0x38 |
                 (ulong)((uVar5 & 8) << 0xd) |
                 (ulong)((uVar5 & 2) << 0x1a) | (ulong)(uVar5 & 1) << 0x3b | 0x80;
    uStack_2d0 = (ulong)(uVar4 >> 0x1b & 2) |
                 (ulong)(uVar4 >> 0x13 & 1) << 0x2d |
                 (ulong)(uVar4 >> 0xf & 1) << 0x31 | (ulong)(uVar4 >> 8 & 1) << 0x34 |
                 (ulong)(uVar4 & 1) << 0x3b |
                 (ulong)(uVar5 >> 0x13 & 0x40) | (ulong)(uVar5 >> 0xd & 1) << 0x33;
    if ((uVar8 == 0) || (uVar23 == 0)) {
      in_XCR0 = 0;
    }
    else if (((~in_XCR0 & 6) == 0 & (byte)(uVar5 >> 0x1c)) == 1) {
      uStack_2d0 = (ulong)(uVar5 >> 0x1d & 1) << 0x38 | (ulong)(uVar5 >> 0xc & 1) << 0x39 |
                   uStack_2d0 | 0x4000;
    }
    if (6 < uVar7) {
      piVar3 = (int *)cpuid_Extended_Feature_Enumeration_info(7);
      uVar8 = piVar3[1];
      uVar4 = piVar3[2];
      uVar5 = piVar3[3];
      uVar25 = (ulong)(uVar8 * 2 & 0x20);
      uVar18 = (ulong)(uVar8 >> 0xb & 1);
      uStack_2c0 = (ulong)(uVar4 >> 0xc & 0x10 |
                           uVar4 & 0x20 |
                           uVar5 >> 2 & 0x100 | uVar5 >> 3 & 0x40 | (uVar5 & 0x20) << 4 | uVar20);
      uStack_2c8 = (ulong)((uVar4 & 0x40000) << 10) |
                   (ulong)(uVar4 >> 0xe & 1) << 0x2c |
                   (ulong)(uVar5 >> 9 & 0x80000 | uVar5 >> 7 & 0x100000) |
                   (ulong)(uVar5 >> 0x16 & 1) << 0x24 | (ulong)(uVar5 >> 4 & 0x10) |
                   (ulong)((uVar5 & 0x10) << 0x16) |
                   (ulong)(uVar5 & 1) << 0x20 | (ulong)(uVar8 >> 0x1d & 1) << 0x30 |
                   (ulong)(uVar8 >> 0x14 & 1) << 0x35 |
                   (ulong)(uVar8 >> 0x12 & 1) << 0x27 | uVar18 << 0x2a |
                   (ulong)(uVar8 >> 7 & 1) << 0x37 | uStack_2c8 | uVar25;
      uVar23 = (ulong)(uVar4 >> 0x14 & 1) << 0x29 |
               (ulong)(uVar4 >> 4 & 1) << 0x3d | (ulong)(uVar5 >> 0x1d & 1) << 0x36 |
               (ulong)(uVar5 >> 0x19 & 1) << 0x2c | (ulong)(uVar5 >> 7 & 1) << 0x2a |
               (ulong)(uVar8 >> 0x18 & 1) << 0x2f | (ulong)(uVar8 >> 0x17 & 1) << 0x2e |
               (ulong)(uVar8 >> 0xe & 0x20) |
               (ulong)(uVar8 >> 9 & 1) << 0x37 | (ulong)(uVar8 >> 8 & 1) << 0x28 |
               (ulong)(uVar8 >> 3 & 1) << 0x27 | (ulong)(uVar8 & 1) << 0x3c | uStack_2d0;
      if (uVar18 != 0 || uVar25 != 0) {
        uStack_2c0 = uStack_2c0 | 8;
      }
      if (((uVar8 & 0x20) != 0) && ((uStack_2d0 & 0x4000) != 0)) {
        uVar23 = uVar23 | 0x8000;
      }
      uStack_2d0 = uVar23;
      if (((byte)(uVar8 >> 0x10) & 1 & (in_XCR0 & 0xe6) == 0xe6) == 1) {
        uStack_2d0 = uStack_2d0 |
                     (ulong)(((uVar8 & 0x220000) * 0x20 + (uVar8 * 2 & 0x8000000) |
                             uVar8 >> 4 & 0x800000) + (uVar8 >> 7 & 0x200000) |
                             uVar8 >> 10 & 0x100000 | uVar8 >> 1 & 0x40000000 | (uVar5 & 2) << 0x1b
                             | (uVar4 & 0x800000) << 2 |
                               (uVar4 & 8) << 0xd |
                               (uVar4 & 4) << 0xf |
                               (uVar5 & 0x1000) << 7 |
                               (uVar5 & 0x800) << 0x14 | (uVar5 & 0x40) << 0x17 | 0x1000000) |
                     (ulong)(uVar5 >> 0xe & 1) << 0x21 | (ulong)(uVar4 >> 8 & 1) << 0x20;
      }
      if ((in_XCR0 & 0x60000) == 0x60000) {
        uStack_2d0 = uStack_2d0 | (uVar4 >> 0xe & 0x900 | uVar4 >> 0xc & 0x1000);
      }
      if (*piVar3 != 0) {
        puVar26 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
        uVar20 = *puVar26;
        uVar4 = puVar26[2];
        uStack_2c0 = uStack_2c0 | (uVar20 >> 8 & 0x800) + (puVar26[1] & 2) * 2;
        uStack_2c8 = (ulong)((uVar4 & 0x4000) << 0x10) |
                     (ulong)(uVar20 >> 4 & 0x800000 | uVar20 >> 0x10 & 0x440) |
                     (ulong)(uVar20 >> 8 & 4) |
                     (ulong)(uVar20 >> 3 & 1) << 0x22 |
                     (ulong)(uVar20 >> 2 & 1) << 0x34 |
                     (ulong)(uVar20 >> 1 & 1) << 0x33 | (ulong)(uVar20 & 1) << 0x31 | uStack_2c8;
        uVar23 = (ulong)(uVar4 >> 8 & 0x2000) | (ulong)(uVar4 >> 0x12 & 1) << 0x2b |
                 (ulong)(uVar20 >> 0xc & 1) << 0x3e | (ulong)(uVar20 >> 0xb) << 0x3f |
                 (ulong)(uVar20 >> 7 & 1) << 0x32 | uStack_2d0;
        if ((short)uStack_2d0 < 0) {
          uVar23 = uVar23 | (ulong)(uVar4 >> 10 & 1) << 0x25 |
                            (ulong)(uVar4 >> 5 & 1) << 0x23 |
                            (ulong)(uVar4 >> 4 & 1) << 0x26 |
                            (ulong)(uVar20 >> 0x17 & 1) << 0x22 | (ulong)(uVar20 >> 4 & 1) << 0x24;
        }
        uStack_2d0 = uVar20 << 0xd & (uint)(uVar23 >> 6) & 0x3ffffff & 0x40000 | uVar23;
        if ((in_XCR0 & 0x60000) == 0x60000) {
          uStack_2d0 = uStack_2d0 | (uVar20 >> 0xb & 0x400) + (uVar4 & 0x100) * 2;
        }
      }
      if (0xc < uVar7) {
        puVar26 = (uint *)cpuid_Processor_Extended_States_info(0xd);
        if (((uVar8 >> 0xe & 1) != 0) && ((in_XCR0 & *puVar26 & 0x18) == 0x18)) {
          uStack_2c8 = uStack_2c8 | 0x200000;
        }
        puVar26 = (uint *)cpuid_Processor_Extended_States_info(0xd);
        uVar20 = (uint)(ushort)(((ushort)*puVar26 & 3) << 8) * 0x40;
        uStack_2c0 = uStack_2c0 |
                     ((*puVar26 & 8) << 0xd | (uVar20 >> 1 & 0x5555) + (uVar20 & 0x5555) * 2);
        if (uVar7 != 0xd) {
          lVar27 = cpuid(0xe);
          uStack_2c8 = uStack_2c8 | (ulong)(*(uint *)(lVar27 + 4) >> 4 & 1) << 0x21;
        }
      }
    }
  }
  uStack_370 = uStack_2c0;
  uVar7 = 0x80000000;
  uVar20 = 0x80000000;
  uVar23 = uStack_2c0;
  uVar18 = uStack_2c8;
  uVar25 = uStack_2d0;
  puVar26 = puVar9;
  uVar30 = uStack_2c8;
  uVar31 = uStack_2d0;
  do {
    if (uVar20 == 0) {
      puVar21 = (uint *)cpuid_basic_info(0);
    }
    else if (uVar20 == 1) {
      puVar21 = (uint *)cpuid_Version_info(1);
    }
    else if (uVar20 == 2) {
      puVar21 = (uint *)cpuid_cache_tlb_info(2);
    }
    else if (uVar20 == 3) {
      puVar21 = (uint *)cpuid_serial_info(3);
    }
    else if (uVar20 == 4) {
      puVar21 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
    }
    else if (uVar20 == 5) {
      puVar21 = (uint *)cpuid_MONITOR_MWAIT_Features_info(5);
    }
    else if (uVar20 == 6) {
      puVar21 = (uint *)cpuid_Thermal_Power_Management_info(6);
    }
    else if (uVar20 == 7) {
      puVar21 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
    }
    else if (uVar20 == 9) {
      puVar21 = (uint *)cpuid_Direct_Cache_Access_info(9);
    }
    else if (uVar20 == 10) {
      puVar21 = (uint *)cpuid_Architectural_Performance_Monitoring_info(10);
    }
    else if (uVar20 == 0xb) {
      puVar21 = (uint *)cpuid_Extended_Topology_info(0xb);
    }
    else if (uVar20 == 0xd) {
      puVar21 = (uint *)cpuid_Processor_Extended_States_info(0xd);
    }
    else if (uVar20 == 0xf) {
      puVar21 = (uint *)cpuid_Quality_of_Service_info(0xf);
    }
    else if (uVar20 == 0x80000002) {
      puVar21 = (uint *)cpuid_brand_part1_info(0x80000002);
    }
    else if (uVar20 == 0x80000003) {
      puVar21 = (uint *)cpuid_brand_part2_info(0x80000003);
    }
    else if (uVar20 == 0x80000004) {
      puVar21 = (uint *)cpuid_brand_part3_info(0x80000004);
    }
    else {
      puVar21 = (uint *)cpuid(uVar20);
    }
    uVar8 = *puVar21;
    uVar4 = puVar21[1];
    uVar5 = puVar21[2];
    uVar11 = puVar21[3];
    switch(uVar20) {
    case 0x80000000:
      uVar7 = uVar8;
      if (0x8000001e < uVar8) {
        uVar7 = 0x8000001f;
      }
      uVar20 = 0x80000000;
      break;
    case 0x80000001:
      uVar23 = uVar23 | (uVar11 >> 0x14 & 2 | uVar11 >> 2 & 1);
      uVar20 = uVar5 >> 0x1e & 1;
      uVar30 = (uVar20 << 4 | uVar5 >> 0x12 & 4) | uVar25;
      uVar8 = (uint)uVar25;
      uVar25 = uVar30;
      if ((uVar8 >> 0xe & 1) != 0) {
        uVar23 = uVar23 | uVar11 * 2 & 0x1000;
        uVar25 = uVar30 | (ulong)(uVar11 >> 0x10 & 1) << 0x3a;
      }
      uVar18 = (ulong)(uVar5 & 0x80000000 | uVar20 << 0xf) |
               (ulong)(uVar5 * 4 & 0x80000000) |
               (ulong)(uVar5 >> 0x1b & 1) << 0x29 | (ulong)(uVar5 >> 7 & 0x8000 | uVar5 >> 0x14 & 2)
               | (ulong)(uVar11 >> 0xc & 0x20000 | (uVar11 & 1) << 9) | uVar18 |
               (ulong)(uVar11 >> 4 & 0x800) |
               (ulong)(uVar11 >> 0xc & 1) << 0x32 |
               (ulong)((uVar11 & 0x100) << 0x17) |
               (ulong)((uVar11 & 0x80) << 0x11) |
               (ulong)(uVar11 >> 6 & 1) << 0x3e | (ulong)((uVar11 & 0x20) << 7);
      uVar20 = 0x80000001;
      uVar30 = uVar18;
      uVar31 = uVar25;
      uStack_370 = uVar23;
      if (iStack_324 == 0x444d41) {
        uVar25 = uVar25 | (uVar11 & 0x10) << 3;
        uVar31 = uVar25;
      }
      break;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
      *puVar26 = uVar8;
      puVar26[1] = uVar4;
      puVar26[2] = uVar11;
      puVar26[3] = uVar5;
      puVar26 = puVar26 + 4;
      if (uVar20 == 0x80000004) {
        uVar20 = 0x80000007;
      }
      break;
    case 0x80000005:
    case 0x80000006:
    case 0x80000007:
      break;
    case 0x80000008:
      uVar25 = uVar25 | (ulong)(uVar4 & 1) << 0x30;
      uVar18 = (ulong)((uVar4 & 0x100) << 5) | (ulong)(uVar4 & 1) << 0x25 | uVar18;
      uVar23 = uVar23 | uVar4 * 2 & 0x400;
      uVar20 = 0x8000001e;
      uVar30 = uVar18;
      uVar31 = uVar25;
      uStack_370 = uVar23;
      break;
    default:
      if (uVar20 == 0x8000001f) {
        uVar18 = uVar18 | (ulong)(uVar8 >> 6 & 1) << 0x23 |
                          (ulong)(uVar8 >> 4 & 1) << 0x2f |
                          (ulong)(uVar8 >> 3 & 1) << 0x2e |
                          (ulong)(uVar8 >> 1 & 1) << 0x2d | (ulong)(uVar8 & 1) << 0x36;
        uVar30 = uVar18;
        uVar20 = 0x8000001f;
      }
    }
    uVar20 = uVar20 + 1;
  } while (uVar20 <= uVar7);
  uStack_2c8 = uVar30;
  uStack_2d0 = uVar31;
  uStack_2c0 = uStack_370;
  puVar26 = puVar9;
  cVar10 = '\0';
  do {
    cVar1 = (char)*puVar26;
    *(char *)puVar26 = '\0';
    if (cVar1 == ' ') {
      cVar19 = '@';
      if ((((cVar10 != '@') &&
           (cVar2 = *(char *)((long)puVar26 + 1), cVar19 = cVar10, cVar2 != '\0')) && (cVar2 != ' ')
          ) && (cVar2 != '@')) goto LAB_0011c44f;
    }
    else {
      if (cVar1 == '\0') {
        *(char *)puVar9 = '\0';
        lVar28 = sysconf(0x54);
        lVar27 = 1;
        if (1 < lVar28) {
          lVar27 = lVar28;
        }
        uStack_328 = (undefined4)lVar27;
        memcpy(CpuInfo::host()::cpuInfoGlobal,&uStack_348,0x98);
        LOCK();
        UNLOCK();
        CpuInfo::host::cpuInfoInitialized = (atomic<unsigned_int>)0x1;
        return;
      }
LAB_0011c44f:
      *(char *)puVar9 = cVar1;
      puVar9 = (uint *)((long)puVar9 + 1);
      cVar19 = cVar1;
    }
    puVar26 = (uint *)((long)puVar26 + 1);
    cVar10 = cVar19;
  } while( true );
}

Assistant:

void ConstPool::fill(void* dst) const noexcept {
  // Clears possible gaps, asmjit should never emit garbage to the output.
  memset(dst, 0, _size);

  ConstPoolFill filler(static_cast<uint8_t*>(dst), 1);
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].forEach(filler);
    filler._dataSize <<= 1;
  }
}